

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O0

void __thiscall
sglr::ShaderProgram::ShaderProgram(ShaderProgram *this,ShaderProgramDeclaration *decl)

{
  value_type vVar1;
  value_type vVar2;
  GenericVecType GVar3;
  DataType DVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  size_type sVar8;
  const_reference pvVar9;
  reference pvVar10;
  reference this_00;
  const_reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  const_reference pvVar14;
  const_reference pvVar15;
  const_reference pvVar16;
  reference pvVar17;
  const_reference pvVar18;
  reference pvVar19;
  ulong local_58;
  size_t ndx_5;
  size_t ndx_4;
  size_t ndx_3;
  size_t ndx_2;
  size_t ndx_1;
  size_t ndx;
  ShaderProgramDeclaration *local_18;
  ShaderProgramDeclaration *decl_local;
  ShaderProgram *this_local;
  
  local_18 = decl;
  decl_local = (ShaderProgramDeclaration *)this;
  sVar6 = pdec::ShaderProgramDeclaration::getVertexInputCount(decl);
  sVar7 = pdec::ShaderProgramDeclaration::getVertexOutputCount(local_18);
  rr::VertexShader::VertexShader(&this->super_VertexShader,sVar6,sVar7);
  sVar6 = pdec::ShaderProgramDeclaration::getGeometryInputCount(local_18);
  sVar7 = pdec::ShaderProgramDeclaration::getGeometryOutputCount(local_18);
  rr::GeometryShader::GeometryShader
            (&this->super_GeometryShader,sVar6,sVar7,(local_18->m_geometryDecl).inputType,
             (local_18->m_geometryDecl).outputType,(local_18->m_geometryDecl).numOutputVertices,
             (local_18->m_geometryDecl).numInvocations);
  sVar6 = pdec::ShaderProgramDeclaration::getFragmentInputCount(local_18);
  sVar7 = pdec::ShaderProgramDeclaration::getFragmentOutputCount(local_18);
  rr::FragmentShader::FragmentShader(&this->super_FragmentShader,sVar6,sVar7);
  (this->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR___cxa_pure_virtual_00cbcc80;
  (this->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_00cbccb8;
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_00cbccd0;
  sVar6 = pdec::ShaderProgramDeclaration::getVertexInputCount(local_18);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&ndx + 3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_attributeNames,sVar6,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&ndx + 3));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&ndx + 3));
  sVar8 = std::vector<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>::size
                    (&local_18->m_uniforms);
  std::allocator<sglr::UniformSlot>::allocator((allocator<sglr::UniformSlot> *)((long)&ndx + 2));
  std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::vector
            (&this->m_uniforms,sVar8,(allocator<sglr::UniformSlot> *)((long)&ndx + 2));
  std::allocator<sglr::UniformSlot>::~allocator((allocator<sglr::UniformSlot> *)((long)&ndx + 2));
  std::__cxx11::string::string((string *)&this->m_vertSrc,(string *)&local_18->m_vertexSource);
  std::__cxx11::string::string((string *)&this->m_fragSrc,(string *)&local_18->m_fragmentSource);
  ndx._0_1_ = 0;
  bVar5 = pdec::ShaderProgramDeclaration::hasGeometryShader(local_18);
  if (bVar5) {
    std::__cxx11::string::string((string *)&this->m_geomSrc,(string *)&local_18->m_geometrySource);
  }
  else {
    std::allocator<char>::allocator();
    ndx._0_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&this->m_geomSrc,"",(allocator<char> *)((long)&ndx + 1));
  }
  if (((byte)ndx & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 1));
  }
  bVar5 = pdec::ShaderProgramDeclaration::hasGeometryShader(local_18);
  this->m_hasGeometryShader = bVar5;
  for (ndx_1 = 0;
      sVar8 = std::vector<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
              ::size(&local_18->m_vertexAttributes), ndx_1 < sVar8; ndx_1 = ndx_1 + 1) {
    pvVar9 = std::vector<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
             ::operator[](&local_18->m_vertexAttributes,ndx_1);
    GVar3 = pvVar9->type;
    pvVar10 = std::vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>::operator[]
                        (&(this->super_VertexShader).m_inputs,ndx_1);
    pvVar10->type = GVar3;
    pvVar9 = std::vector<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
             ::operator[](&local_18->m_vertexAttributes,ndx_1);
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->m_attributeNames,ndx_1);
    std::__cxx11::string::operator=((string *)this_00,(string *)pvVar9);
  }
  if ((this->m_hasGeometryShader & 1U) == 0) {
    for (ndx_4 = 0;
        sVar8 = std::
                vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                ::size(&local_18->m_vertexToFragmentVaryings), ndx_4 < sVar8; ndx_4 = ndx_4 + 1) {
      pvVar15 = std::
                vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                ::operator[](&local_18->m_vertexToFragmentVaryings,ndx_4);
      GVar3 = pvVar15->type;
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_VertexShader).m_outputs,ndx_4);
      pvVar12->type = GVar3;
      pvVar15 = std::
                vector<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
                ::operator[](&local_18->m_vertexToFragmentVaryings,ndx_4);
      bVar5 = pvVar15->flatshade;
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_VertexShader).m_outputs,ndx_4);
      pvVar12->flatshade = (bool)(bVar5 & 1);
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_VertexShader).m_outputs,ndx_4);
      pvVar13 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_FragmentShader).m_inputs,ndx_4);
      pvVar13->type = pvVar12->type;
      pvVar13->flatshade = pvVar12->flatshade;
    }
  }
  else {
    for (ndx_2 = 0;
        sVar8 = std::
                vector<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                ::size(&local_18->m_vertexToGeometryVaryings), ndx_2 < sVar8; ndx_2 = ndx_2 + 1) {
      pvVar11 = std::
                vector<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                ::operator[](&local_18->m_vertexToGeometryVaryings,ndx_2);
      GVar3 = *(GenericVecType *)pvVar11;
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_VertexShader).m_outputs,ndx_2);
      pvVar12->type = GVar3;
      pvVar11 = std::
                vector<sglr::pdec::VertexToGeometryVarying,_std::allocator<sglr::pdec::VertexToGeometryVarying>_>
                ::operator[](&local_18->m_vertexToGeometryVaryings,ndx_2);
      vVar1 = pvVar11[4];
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_VertexShader).m_outputs,ndx_2);
      pvVar12->flatshade = (bool)((byte)vVar1 & 1);
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_VertexShader).m_outputs,ndx_2);
      pvVar13 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_GeometryShader).m_inputs,ndx_2);
      pvVar13->type = pvVar12->type;
      pvVar13->flatshade = pvVar12->flatshade;
    }
    for (ndx_3 = 0;
        sVar8 = std::
                vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                ::size(&local_18->m_geometryToFragmentVaryings), ndx_3 < sVar8; ndx_3 = ndx_3 + 1) {
      pvVar14 = std::
                vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                ::operator[](&local_18->m_geometryToFragmentVaryings,ndx_3);
      GVar3 = *(GenericVecType *)pvVar14;
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_GeometryShader).m_outputs,ndx_3);
      pvVar12->type = GVar3;
      pvVar14 = std::
                vector<sglr::pdec::GeometryToFragmentVarying,_std::allocator<sglr::pdec::GeometryToFragmentVarying>_>
                ::operator[](&local_18->m_geometryToFragmentVaryings,ndx_3);
      vVar2 = pvVar14[4];
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_GeometryShader).m_outputs,ndx_3);
      pvVar12->flatshade = (bool)((byte)vVar2 & 1);
      pvVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_GeometryShader).m_outputs,ndx_3);
      pvVar13 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](&(this->super_FragmentShader).m_inputs,ndx_3);
      pvVar13->type = pvVar12->type;
      pvVar13->flatshade = pvVar12->flatshade;
    }
  }
  for (ndx_5 = 0;
      sVar8 = std::vector<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>::
              size(&local_18->m_fragmentOutputs), ndx_5 < sVar8; ndx_5 = ndx_5 + 1) {
    pvVar16 = std::vector<sglr::pdec::FragmentOutput,_std::allocator<sglr::pdec::FragmentOutput>_>::
              operator[](&local_18->m_fragmentOutputs,ndx_5);
    GVar3 = pvVar16->type;
    pvVar17 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::
              operator[](&(this->super_FragmentShader).m_outputs,ndx_5);
    pvVar17->type = GVar3;
  }
  for (local_58 = 0;
      sVar8 = std::vector<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>::size
                        (&local_18->m_uniforms), local_58 < sVar8; local_58 = local_58 + 1) {
    pvVar18 = std::vector<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>::operator[]
                        (&local_18->m_uniforms,local_58);
    pvVar19 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                        (&this->m_uniforms,local_58);
    std::__cxx11::string::operator=((string *)pvVar19,(string *)pvVar18);
    pvVar18 = std::vector<sglr::pdec::Uniform,_std::allocator<sglr::pdec::Uniform>_>::operator[]
                        (&local_18->m_uniforms,local_58);
    DVar4 = pvVar18->type;
    pvVar19 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                        (&this->m_uniforms,local_58);
    pvVar19->type = DVar4;
  }
  return;
}

Assistant:

ShaderProgram::ShaderProgram (const pdec::ShaderProgramDeclaration& decl)
	: rr::VertexShader		(decl.getVertexInputCount(), decl.getVertexOutputCount())
	, rr::GeometryShader	(decl.getGeometryInputCount(),
							 decl.getGeometryOutputCount(),
							 decl.m_geometryDecl.inputType,
							 decl.m_geometryDecl.outputType,
							 decl.m_geometryDecl.numOutputVertices,
							 decl.m_geometryDecl.numInvocations)
	, rr::FragmentShader	(decl.getFragmentInputCount(), decl.getFragmentOutputCount())
	, m_attributeNames		(decl.getVertexInputCount())
	, m_uniforms			(decl.m_uniforms.size())
	, m_vertSrc				(decl.m_vertexSource)
	, m_fragSrc				(decl.m_fragmentSource)
	, m_geomSrc				(decl.hasGeometryShader() ? (decl.m_geometrySource) : (""))
	, m_hasGeometryShader	(decl.hasGeometryShader())
{
	DE_ASSERT(decl.valid());

	// Set up shader IO

	for (size_t ndx = 0; ndx < decl.m_vertexAttributes.size(); ++ndx)
	{
		this->rr::VertexShader::m_inputs[ndx].type	= decl.m_vertexAttributes[ndx].type;
		m_attributeNames[ndx]						= decl.m_vertexAttributes[ndx].name;
	}

	if (m_hasGeometryShader)
	{
		for (size_t ndx = 0; ndx < decl.m_vertexToGeometryVaryings.size(); ++ndx)
		{
			this->rr::VertexShader::m_outputs[ndx].type			= decl.m_vertexToGeometryVaryings[ndx].type;
			this->rr::VertexShader::m_outputs[ndx].flatshade	= decl.m_vertexToGeometryVaryings[ndx].flatshade;

			this->rr::GeometryShader::m_inputs[ndx]				= this->rr::VertexShader::m_outputs[ndx];
		}
		for (size_t ndx = 0; ndx < decl.m_geometryToFragmentVaryings.size(); ++ndx)
		{
			this->rr::GeometryShader::m_outputs[ndx].type		= decl.m_geometryToFragmentVaryings[ndx].type;
			this->rr::GeometryShader::m_outputs[ndx].flatshade	= decl.m_geometryToFragmentVaryings[ndx].flatshade;

			this->rr::FragmentShader::m_inputs[ndx]				= this->rr::GeometryShader::m_outputs[ndx];
		}
	}
	else
	{
		for (size_t ndx = 0; ndx < decl.m_vertexToFragmentVaryings.size(); ++ndx)
		{
			this->rr::VertexShader::m_outputs[ndx].type			= decl.m_vertexToFragmentVaryings[ndx].type;
			this->rr::VertexShader::m_outputs[ndx].flatshade	= decl.m_vertexToFragmentVaryings[ndx].flatshade;

			this->rr::FragmentShader::m_inputs[ndx]				= this->rr::VertexShader::m_outputs[ndx];
		}
	}

	for (size_t ndx = 0; ndx < decl.m_fragmentOutputs.size(); ++ndx)
		this->rr::FragmentShader::m_outputs[ndx].type = decl.m_fragmentOutputs[ndx].type;

	// Set up uniforms

	for (size_t ndx = 0; ndx < decl.m_uniforms.size(); ++ndx)
	{
		this->m_uniforms[ndx].name = decl.m_uniforms[ndx].name;
		this->m_uniforms[ndx].type = decl.m_uniforms[ndx].type;
	}
}